

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_transform_kernel_int8_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  ulong *puVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined4 uVar14;
  undefined4 uVar16;
  undefined1 auVar15 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar18 [16];
  short sVar19;
  undefined1 in_XMM9 [16];
  undefined1 auVar20 [16];
  short sVar22;
  short sVar23;
  undefined1 in_XMM10 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar25 [16];
  undefined4 uVar26;
  undefined1 in_XMM13 [16];
  undefined1 auVar27 [16];
  short tmp [4] [3];
  undefined8 uStack_50;
  undefined1 local_48 [16];
  ulong local_38;
  
  uStack_50 = 0x12990a;
  Mat::create(kernel_tm,0x10,inch,outch,2,(Allocator *)0x0);
  auVar5 = _DAT_001720f0;
  if (0 < outch) {
    pvVar2 = kernel->data;
    iVar1 = kernel_tm->w;
    puVar6 = (ulong *)kernel_tm->data;
    sVar3 = kernel_tm->elemsize;
    sVar4 = kernel_tm->cstep;
    uVar7 = 0;
    do {
      if (0 < inch) {
        iVar8 = inch * 9 * (int)uVar7;
        uVar12 = 0;
        puVar11 = puVar6;
        do {
          lVar9 = uVar12 * 9;
          auVar20 = pshuflw(in_XMM9,ZEXT416((uint)(int)*(char *)((long)pvVar2 + lVar9 + iVar8)),0);
          auVar21 = pshuflw(in_XMM10,ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                                 lVar9 + (long)iVar8 + 1)),0);
          auVar13 = ZEXT416((uint)(int)*(char *)((long)pvVar2 + lVar9 + (long)iVar8 + 2));
          auVar13 = pshuflw(auVar13,auVar13,0);
          auVar24 = pshuflw(in_XMM11,ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                                 lVar9 + (long)iVar8 + 3)),0);
          auVar25 = pshuflw(in_XMM12,ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                                 lVar9 + (long)iVar8 + 4)),0);
          auVar27 = pshuflw(in_XMM13,ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                                 lVar9 + (long)iVar8 + 5)),0);
          auVar18 = pshuflw(in_XMM8,ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                                lVar9 + (long)iVar8 + 6)),0);
          auVar17 = pshuflw(in_XMM7,ZEXT416((uint)(int)*(char *)((long)pvVar2 +
                                                                lVar9 + (long)iVar8 + 7)),0);
          auVar15 = ZEXT416((uint)(int)*(char *)((long)pvVar2 + lVar9 + (long)iVar8 + 8));
          auVar15 = pshuflw(auVar15,auVar15,0);
          sVar19 = auVar20._0_2_ * 2;
          sVar22 = auVar21._2_2_ + auVar20._2_2_;
          sVar23 = auVar20._4_2_ - auVar21._4_2_;
          in_XMM10 = ZEXT616(CONCAT24(sVar23,CONCAT22(sVar22,sVar19)));
          auVar13._0_8_ =
               CONCAT26(auVar13._6_2_ * 2,
                        CONCAT24(auVar13._4_2_ + sVar23,CONCAT22(auVar13._2_2_ + sVar22,sVar19)));
          sVar19 = auVar24._0_2_ * 2;
          in_XMM11 = ZEXT616(CONCAT24(auVar24._4_2_,CONCAT22(auVar24._2_2_,sVar19)));
          sVar22 = auVar25._2_2_ + auVar24._2_2_;
          sVar23 = auVar24._4_2_ - auVar25._4_2_;
          in_XMM12 = ZEXT616(CONCAT24(sVar23,CONCAT22(sVar22,sVar19)));
          uVar26 = CONCAT22(auVar27._2_2_ + sVar22,sVar19);
          in_XMM13._0_8_ = CONCAT26(auVar27._6_2_ * 2,CONCAT24(auVar27._4_2_ + sVar23,uVar26));
          in_XMM13._8_8_ = 0;
          auVar13._8_8_ = in_XMM13._0_8_;
          sVar23 = auVar18._0_2_ * 2;
          sVar19 = auVar17._2_2_ + auVar18._2_2_;
          sVar22 = auVar18._4_2_ - auVar17._4_2_;
          uVar14 = CONCAT22(auVar15._2_2_ + sVar19,sVar23);
          auVar17 = pshufhw(ZEXT616(CONCAT24(sVar22,CONCAT22(sVar19,sVar23))),auVar13,0xc6);
          auVar18._0_4_ = auVar17._0_4_;
          auVar18._8_4_ = auVar17._8_4_;
          auVar18._4_4_ = auVar17._12_4_;
          auVar18._12_4_ = auVar17._4_4_;
          auVar17 = pshuflw(auVar18,auVar18,0x68);
          auVar17 = pshufhw(auVar17,auVar17,0x25);
          uVar16 = (undefined4)
                   (CONCAT26(auVar15._6_2_ * 2,CONCAT24(auVar15._4_2_ + sVar22,uVar14)) >> 0x20);
          in_XMM8._4_4_ = uVar14;
          in_XMM8._0_4_ = uVar14;
          in_XMM8._8_4_ = uVar14;
          in_XMM8._12_4_ = uVar14;
          in_XMM9 = ~auVar5 & in_XMM8 | auVar17 & auVar5;
          auVar15._4_4_ = (undefined4)((ulong)auVar13._0_8_ >> 0x20);
          auVar15._12_4_ = (undefined4)(in_XMM13._0_8_ >> 0x20);
          auVar15._0_4_ = auVar15._12_4_;
          auVar15._8_4_ = uVar26;
          auVar13 = pshuflw(auVar15,auVar15,0xdc);
          local_38 = CONCAT44(uVar16,uVar16) & 0xffff00000000ffff | auVar13._0_8_ & 0xffffffff0000;
          local_48 = in_XMM9;
          lVar9 = 4;
          puVar10 = puVar11;
          do {
            auVar13 = pshuflw(ZEXT216(*(ushort *)(local_48 + lVar9 + -4)),
                              ZEXT216(*(ushort *)(local_48 + lVar9 + -4)),0);
            auVar15 = pshuflw(ZEXT216(*(ushort *)(local_48 + lVar9 + -2)),
                              ZEXT216(*(ushort *)(local_48 + lVar9 + -2)),0);
            auVar17 = pshuflw(ZEXT216(*(ushort *)(local_48 + lVar9)),
                              ZEXT216(*(ushort *)(local_48 + lVar9)),0);
            in_XMM7._0_8_ =
                 CONCAT26(auVar17._6_2_ * 2,
                          CONCAT24(auVar17._4_2_ + (auVar13._4_2_ - auVar15._4_2_),
                                   CONCAT22(auVar17._2_2_ + auVar15._2_2_ + auVar13._2_2_,
                                            auVar13._0_2_ * 2)));
            in_XMM7._8_8_ = 0;
            *puVar10 = in_XMM7._0_8_;
            puVar10 = puVar10 + 1;
            lVar9 = lVar9 + 6;
          } while (lVar9 != 0x1c);
          uVar12 = uVar12 + 1;
          puVar11 = (ulong *)((long)puVar11 + (long)iVar1 * sVar3);
        } while (uVar12 != (uint)inch);
      }
      uVar7 = uVar7 + 1;
      puVar6 = (ulong *)((long)puVar6 + sVar4 * sVar3);
    } while (uVar7 != (uint)outch);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_int8_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch)
{
    kernel_tm.create(4*4, inch, outch, 2ul);  

    // G
    const short ktm[4][3] = {
        {   2,     0,     0},
        {   1,     1,     1},
        {   1,    -1,     1},
        {   0,     0,     2}
    };

    #pragma omp parallel for
    for (int p = 0; p<outch; p++)
    {
        for (int q = 0; q<inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p*inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[4][3];
            for (int i=0; i<4; i++)
            {
                tmp[i][0] = (short)k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = (short)k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = (short)k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j=0; j<4; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i=0; i<4; i++)
                {
                    kernel_tm0[j*4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}